

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O1

void __thiscall tst_InsertProxyModel::testProperties(tst_InsertProxyModel *this)

{
  QFlags<InsertProxyModel::InsertDirection> QVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  QAbstractItemModelTester *this_00;
  QMetaType QVar5;
  char *pcVar6;
  char *pcVar7;
  anon_union_24_3_e3d07ef4_for_data *paVar8;
  QMetaType in_stack_ffffffffffffff98;
  bool local_5d;
  QFlags<InsertProxyModel::InsertDirection> t;
  anon_union_24_3_e3d07ef4_for_data local_58;
  byte local_40;
  InsertProxyModel proxyModel;
  
  InsertProxyModel::InsertProxyModel(&proxyModel,(QObject *)0x0);
  this_00 = (QAbstractItemModelTester *)operator_new(0x10);
  QAbstractItemModelTester::QAbstractItemModelTester
            (this_00,(QAbstractItemModel *)&proxyModel,QtTest,&this->super_QObject);
  *(undefined ***)this_00 = &PTR_metaObject_0012c978;
  t.i = 3;
  QVariant::QVariant((QVariant *)&local_58,(QMetaType)0x12d680,&t);
  bVar2 = (bool)QObject::setProperty((char *)&proxyModel,(QVariant *)"insertDirection");
  cVar3 = QTest::qVerify(bVar2,
                         "proxyModel.setProperty(\"insertDirection\", QVariant::fromValue(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow))"
                         ,"",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,499);
  QVariant::~QVariant((QVariant *)&local_58);
  if (cVar3 != '\0') {
    paVar8 = &local_58;
    QObject::property((char *)paVar8->data);
    bVar2 = operator==(in_stack_ffffffffffffff98,(QMetaType)0x11290f);
    if (bVar2) {
      if ((local_40 & 1) != 0) {
        paVar8 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_58.shared + *(int *)(local_58.shared + 4));
      }
      t.i = *(Int *)paVar8;
    }
    else {
      t.i = 0;
      paVar8 = &local_58;
      QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if ((local_40 & 1) != 0) {
        paVar8 = (anon_union_24_3_e3d07ef4_for_data *)
                 (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QMetaType::convert(QVar5,paVar8,(QMetaType)0x12d680,&t);
    }
    QVar1.i = t.i;
    pcVar6 = (char *)operator_new__(0xb);
    qsnprintf(pcVar6,0xb,"0x%x",(ulong)QVar1.i);
    pcVar7 = (char *)operator_new__(0xb);
    qsnprintf(pcVar7,0xb,"0x%x",3);
    cVar3 = QTest::compare_helper
                      (QVar1.i == 3,"Compared values are not the same",pcVar6,pcVar7,
                       "proxyModel.property(\"insertDirection\").value<InsertProxyModel::InsertDirections>()"
                       ,"InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                       ,0x1f5);
    QVariant::~QVariant((QVariant *)&local_58);
    if (cVar3 != '\0') {
      QVariant::QVariant((QVariant *)&local_58,false);
      bVar2 = (bool)QObject::setProperty((char *)&proxyModel,(QVariant *)"mergeDisplayEdit");
      cVar3 = QTest::qVerify(bVar2,"proxyModel.setProperty(\"mergeDisplayEdit\", false)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                             ,0x1f6);
      QVariant::~QVariant((QVariant *)&local_58);
      if (cVar3 != '\0') {
        QObject::property((char *)local_58.data);
        bVar4 = QVariant::toBool();
        t.i._0_1_ = bVar4;
        local_5d = false;
        pcVar6 = QTest::toString<bool>((bool *)&t);
        pcVar7 = QTest::toString<bool>(&local_5d);
        QTest::compare_helper
                  ((bool)(bVar4 ^ 1),"Compared values are not the same",pcVar6,pcVar7,
                   "proxyModel.property(\"mergeDisplayEdit\").toBool()","false",
                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                   ,0x1f7);
        QVariant::~QVariant((QVariant *)&local_58);
      }
    }
  }
  InsertProxyModel::~InsertProxyModel(&proxyModel);
  return;
}

Assistant:

void tst_InsertProxyModel::testProperties()
{
    InsertProxyModel proxyModel;
    new ModelTest(&proxyModel, this);
    QVERIFY(proxyModel.setProperty("insertDirection", QVariant::fromValue(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow)));
    QCOMPARE(proxyModel.property("insertDirection").value<InsertProxyModel::InsertDirections>(),
             InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow);
    QVERIFY(proxyModel.setProperty("mergeDisplayEdit", false));
    QCOMPARE(proxyModel.property("mergeDisplayEdit").toBool(), false);
}